

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 extraout_XMM0_Qb;
  
  if (((int)CONCAT71(in_register_00000011,hide_text_after_double_hash) != 0) &&
     (pcVar2 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end), text_end = text,
     pcVar1 = text, text < pcVar2)) {
    do {
      text_end = pcVar1;
      if (*pcVar1 == '#') {
        if (pcVar1[1] == '#') break;
      }
      else if (*pcVar1 == '\0') break;
      pcVar1 = pcVar1 + 1;
      text_end = pcVar2;
    } while (pcVar1 != pcVar2);
  }
  if (text_end == text) {
    IVar3 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
  }
  else {
    auVar4._0_8_ = ImFont::CalcTextSizeA
                             (GImGui->Font,GImGui->FontSize,3.4028235e+38,wrap_width,text,text_end,
                              (char **)0x0);
    auVar4._8_8_ = extraout_XMM0_Qb;
    auVar5._4_12_ = auVar4._4_12_;
    auVar5._0_4_ = (float)(int)(auVar4._0_4_ + 0.99999);
    IVar3 = auVar5._0_8_;
  }
  return IVar3;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Round
    // FIXME: This has been here since Dec 2015 (7b0bf230) but down the line we want this out.
    // FIXME: Investigate using ceilf or e.g.
    // - https://git.musl-libc.org/cgit/musl/tree/src/math/ceilf.c
    // - https://embarkstudios.github.io/rust-gpu/api/src/libm/math/ceilf.rs.html
    text_size.x = IM_FLOOR(text_size.x + 0.99999f);

    return text_size;
}